

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpDisassemble::OnCallIndirectExpr
          (BinaryReaderObjdumpDisassemble *this,uint32_t sig_index,uint32_t table_index)

{
  bool bVar1;
  size_type sVar2;
  const_pointer pvVar3;
  size_type sVar4;
  const_pointer pvVar5;
  undefined1 local_40 [8];
  string_view type_name;
  string_view table_name;
  uint32_t table_index_local;
  uint32_t sig_index_local;
  BinaryReaderObjdumpDisassemble *this_local;
  
  join_0x00000010_0x00000000_ =
       anon_unknown_15::BinaryReaderObjdumpBase::GetTableName
                 (&this->super_BinaryReaderObjdumpBase,table_index);
  _local_40 = anon_unknown_15::BinaryReaderObjdumpBase::GetTypeName
                        (&this->super_BinaryReaderObjdumpBase,sig_index);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
  if ((bVar1) ||
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&type_name._M_str),
     bVar1)) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&type_name._M_str);
    if (bVar1) {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
      if (bVar1) {
        LogOpcode(this,"%u (type %u)",(ulong)table_index,(ulong)sig_index);
      }
      else {
        sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
        LogOpcode(this,"%u (type %u <%.*s>)",(ulong)table_index,(ulong)sig_index,sVar2 & 0xffffffff,
                  pvVar3);
      }
    }
    else {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)&type_name._M_str);
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&type_name._M_str);
      LogOpcode(this,"%u <%.*s> (type %u)",(ulong)table_index,sVar2 & 0xffffffff,pvVar3,
                (ulong)sig_index);
    }
  }
  else {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&type_name._M_str);
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&type_name._M_str);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_40);
    LogOpcode(this,"%u <%.*s> (type %u <%.*s>)",(ulong)table_index,sVar2 & 0xffffffff,pvVar3,
              (ulong)sig_index,(int)sVar4,pvVar5);
  }
  this->skip_next_opcode_ = true;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnCallIndirectExpr(
    uint32_t sig_index,
    uint32_t table_index) {
  std::string_view table_name = GetTableName(table_index);
  std::string_view type_name = GetTypeName(sig_index);
  if (!type_name.empty() && !table_name.empty()) {
    LogOpcode("%u <" PRIstringview "> (type %u <" PRIstringview ">)",
              table_index, WABT_PRINTF_STRING_VIEW_ARG(table_name), sig_index,
              WABT_PRINTF_STRING_VIEW_ARG(type_name));
  } else if (!table_name.empty()) {
    LogOpcode("%u <" PRIstringview "> (type %u)", table_index,
              WABT_PRINTF_STRING_VIEW_ARG(table_name), sig_index);
  } else if (!type_name.empty()) {
    LogOpcode("%u (type %u <" PRIstringview ">)", table_index, sig_index,
              WABT_PRINTF_STRING_VIEW_ARG(type_name));
  } else {
    LogOpcode("%u (type %u)", table_index, sig_index);
  }
  skip_next_opcode_ = true;
  return Result::Ok;
}